

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96.c
# Opt level: O0

err_t bign96Start(void *state,bign_params *params)

{
  bool_t bVar1;
  size_t sVar2;
  size_t sVar3;
  ec_o *ec_00;
  word wVar4;
  long *in_RSI;
  octet *in_RDI;
  void *stack;
  ec_o *ec;
  qr_o *f;
  size_t ec_keep;
  size_t f_keep;
  size_t n;
  size_t in_stack_ffffffffffffffa8;
  qr_o *r;
  word *in_stack_ffffffffffffffb0;
  qr_o *src;
  void *stack_00;
  
  stack_00 = (void *)0x3;
  sVar2 = gfpCreate_keep(0x1648d1);
  sVar3 = ecpCreateJ_keep((size_t)stack_00);
  ec_00 = (ec_o *)(in_RDI + sVar3);
  r = (qr_o *)((long)&(ec_00->hdr).keep + sVar2);
  bVar1 = gfpCreate(r,(octet *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(void *)0x164920)
  ;
  if (((bVar1 == 0) ||
      (sVar2 = wwBitSize(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8), sVar2 != 0xc0)) ||
     (wVar4 = wwGetBits((word *)ec_00->f,0,2), wVar4 != 3)) {
    return 0x1f6;
  }
  bVar1 = ecpCreateJ((ec_o *)n,(qr_o *)f_keep,(octet *)ec_keep,(octet *)f,ec);
  if (((bVar1 != 0) &&
      (src = r, bVar1 = ecCreateGroup(ec_00,in_RDI,(octet *)r,(octet *)in_stack_ffffffffffffffb0,
                                      (size_t)r,0,stack_00), bVar1 != 0)) &&
     ((sVar2 = wwBitSize(in_stack_ffffffffffffffb0,(size_t)r), sVar2 == *in_RSI * 2 &&
      (bVar1 = zzIsEven(*(word **)(in_RDI + 0x38),(size_t)stack_00), bVar1 == 0)))) {
    objAppend(in_RDI,src,(size_t)in_stack_ffffffffffffffb0);
    return 0;
  }
  return 0x1f6;
}

Assistant:

err_t bign96Start(void* state, const bign_params* params)
{
	// размерности
	size_t n;
	size_t f_keep;
	size_t ec_keep;
	// состояние
	qr_o* f;		/* поле */
	ec_o* ec;		/* кривая */
	void* stack;	/* вложенный стек */
	// pre
	ASSERT(memIsValid(params, sizeof(bign_params)));
	ASSERT(params->l == 96);
	ASSERT(memIsValid(state, bign96Start_keep(0)));
	// определить размерности
	n = W_OF_B(192);
	f_keep = gfpCreate_keep(24);
	ec_keep = ecpCreateJ_keep(n);
	// создать поле и выполнить минимальные проверки p
	f = (qr_o*)((octet*)state + ec_keep);
	stack = (octet*)f + f_keep;
	if (!gfpCreate(f, params->p, 24, stack) ||
		wwBitSize(f->mod, n) != 192 ||
		wwGetBits(f->mod, 0, 2) != 3)
		return ERR_BAD_PARAMS;
	// создать кривую и группу, выполнить минимальную проверку order
	ec = (ec_o*)state;
	if (!ecpCreateJ(ec, f, params->a, params->b, stack) ||
		!ecCreateGroup(ec, 0, params->yG, params->q, 24, 1, stack) ||
		wwBitSize(ec->order, n) != params->l * 2 ||
		zzIsEven(ec->order, n))
		return ERR_BAD_PARAMS;
	// присоединить f к ec
	objAppend(ec, f, 0);
	// все нормально
	return ERR_OK;
}